

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O2

int PSolveB(sunrealtype t,N_Vector c,N_Vector cB,N_Vector fcB,N_Vector r,N_Vector z,
           sunrealtype gamma,sunrealtype delta,int lr,void *user_data)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  N_VScale(0x3ff0000000000000,r,z);
  GSIter(-gamma,z,*(N_Vector *)((long)user_data + 0x9940),(WebData)user_data);
  iVar1 = *(int *)((long)user_data + 0x5c);
  uVar10 = 0;
  uVar6 = (ulong)*(uint *)((long)user_data + 0x50);
  if ((int)*(uint *)((long)user_data + 0x50) < 1) {
    uVar6 = uVar10;
  }
  lVar12 = (long)*(int *)((long)user_data + 0x48);
  uVar9 = (ulong)*(uint *)((long)user_data + 0x54);
  if ((int)*(uint *)((long)user_data + 0x54) < 1) {
    uVar9 = uVar10;
  }
  lVar7 = 0;
  for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    iVar2 = *(int *)((long)user_data + uVar10 * 4 + 0xd0);
    iVar5 = (int)lVar7;
    lVar7 = lVar12 * uVar6 + (long)iVar5;
    lVar13 = (long)iVar5 << 3;
    for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
      lVar8 = (long)*(int *)((long)user_data + uVar11 * 4 + 0x80) + (long)iVar2 * (long)iVar1;
      uVar3 = *(undefined8 *)((long)user_data + lVar8 * 8);
      uVar4 = *(undefined8 *)((long)user_data + lVar8 * 8 + 0x20);
      lVar8 = N_VGetArrayPointer(z);
      SUNDlsMat_denseGETRS(uVar3,lVar12,uVar4,lVar8 + lVar13);
      lVar13 = lVar13 + lVar12 * 8;
    }
  }
  return 0;
}

Assistant:

static int PSolveB(sunrealtype t, N_Vector c, N_Vector cB, N_Vector fcB,
                   N_Vector r, N_Vector z, sunrealtype gamma, sunrealtype delta,
                   int lr, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  int jx, jy, igx, igy, iv, ig, *jigx, *jigy, mx, my, ngx, mp;
  WebData wdata;

  wdata = (WebData)user_data;

  N_VScale(ONE, r, z);

  /* call GSIter for Gauss-Seidel iterations (same routine but with gamma=-gamma) */

  GSIter(-gamma, z, wdata->vtempB, wdata);

  /* Do backsolves for inverse of block-diagonal preconditioner factor */

  P     = wdata->P;
  pivot = wdata->pivot;
  mx    = wdata->mx;
  my    = wdata->my;
  ngx   = wdata->ngx;
  mp    = wdata->mp;
  jigx  = wdata->jigx;
  jigy  = wdata->jigy;

  iv = 0;
  for (jy = 0; jy < my; jy++)
  {
    igy = jigy[jy];
    for (jx = 0; jx < mx; jx++)
    {
      igx = jigx[jx];
      ig  = igx + igy * ngx;
      SUNDlsMat_denseGETRS(P[ig], mp, pivot[ig], &(N_VGetArrayPointer(z)[iv]));
      iv += mp;
    }
  }

  return (0);
}